

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgfmt.cpp
# Opt level: O3

void __thiscall icu_63::MessageFormat::setFormat(MessageFormat *this,int32_t n,Format *newFormat)

{
  Part *pPVar1;
  UMessagePatternPartType *pUVar2;
  uint in_EAX;
  int iVar3;
  undefined4 extraout_var;
  Part *pPVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  UErrorCode status;
  undefined8 uStack_18;
  
  if (-1 < n) {
    pPVar1 = (this->msgPattern).parts;
    uVar6 = 0;
    iVar3 = 0;
    do {
      if ((int)uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        uVar5 = pPVar1[uVar6].limitPartIndex;
        if ((int)uVar6 < (int)uVar5) {
          uVar6 = (ulong)uVar5;
        }
      }
      pPVar4 = pPVar1 + uVar6 + 1;
      do {
        pUVar2 = &pPVar4->type;
        if (*pUVar2 == UMSGPAT_PART_TYPE_MSG_LIMIT) {
          return;
        }
        uVar5 = (int)uVar6 + 1;
        uVar6 = (ulong)uVar5;
        pPVar4 = pPVar4 + 1;
      } while (*pUVar2 != UMSGPAT_PART_TYPE_ARG_START);
      bVar7 = iVar3 != n;
      iVar3 = iVar3 + 1;
    } while (bVar7);
    uStack_18._0_4_ = in_EAX;
    iVar3 = (*(newFormat->super_UObject)._vptr_UObject[4])(newFormat);
    if ((Format *)CONCAT44(extraout_var,iVar3) != (Format *)0x0) {
      uStack_18 = (ulong)(uint)uStack_18;
      setCustomArgStartFormat
                (this,uVar5,(Format *)CONCAT44(extraout_var,iVar3),
                 (UErrorCode *)((long)&uStack_18 + 4));
    }
  }
  return;
}

Assistant:

void
MessageFormat::setFormat(int32_t n, const Format& newFormat) {

    if (n >= 0) {
        int32_t formatNumber = 0;
        for (int32_t partIndex = 0;
             (partIndex = nextTopLevelArgStart(partIndex)) >= 0;) {
            if (n == formatNumber) {
                Format* new_format = newFormat.clone();
                if (new_format) {
                    UErrorCode status = U_ZERO_ERROR;
                    setCustomArgStartFormat(partIndex, new_format, status);
                }
                return;
            }
            ++formatNumber;
        }
    }
}